

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_map_union.hh
# Opt level: O1

void avro::codec_traits<umu::_union_map_union_Union__1__>::encode
               (Encoder *e,_union_map_union_Union__1__ *v)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>_>_>
  _Stack_48;
  
  (**(code **)(*(long *)e + 0xa0))(e,v->idx_);
  if (v->idx_ != 1) {
    if (v->idx_ == 0) {
      umu::_union_map_union_Union__1__::get_map_abi_cxx11_
                ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>_>_>
                  *)&_Stack_48,v);
      codec_traits<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>_>_>_>
      ::encode(e,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>_>_>
                  *)&_Stack_48);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_umu::r3>_>_>
      ::~_Rb_tree(&_Stack_48);
    }
    return;
  }
  (**(code **)(*(long *)e + 0x20))(e);
  return;
}

Assistant:

static void encode(Encoder& e, umu::_union_map_union_Union__1__ v) {
        e.encodeUnionIndex(v.idx());
        switch (v.idx()) {
        case 0:
            avro::encode(e, v.get_map());
            break;
        case 1:
            e.encodeNull();
            break;
        }
    }